

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

OnigUChar * onig_get_contents_end_by_callout_args(OnigCalloutArgs *args)

{
  CalloutListEntry *pCVar1;
  CalloutListEntry *e;
  int num;
  OnigCalloutArgs *args_local;
  
  pCVar1 = onig_reg_callout_list_at(args->regex,args->num);
  if (pCVar1 == (CalloutListEntry *)0x0) {
    args_local = (OnigCalloutArgs *)0x0;
  }
  else if (pCVar1->of == ONIG_CALLOUT_OF_CONTENTS) {
    args_local = (OnigCalloutArgs *)(pCVar1->u).content.end;
  }
  else {
    args_local = (OnigCalloutArgs *)0x0;
  }
  return (OnigUChar *)args_local;
}

Assistant:

extern const UChar*
onig_get_contents_end_by_callout_args(OnigCalloutArgs* args)
{
  int num;
  CalloutListEntry* e;

  num = args->num;
  e = onig_reg_callout_list_at(args->regex, num);
  if (IS_NULL(e)) return 0;
  if (e->of == ONIG_CALLOUT_OF_CONTENTS) {
    return e->u.content.end;
  }

  return 0;
}